

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_safe_block_queue.h
# Opt level: O3

FuncCallInfo * __thiscall
cppnet::ThreadSafeBlockQueue<FuncCallInfo_*>::Pop(ThreadSafeBlockQueue<FuncCallInfo_*> *this)

{
  FuncCallInfo *pFVar1;
  _Elt_pointer ppFVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  local_20._M_owns = false;
  local_20._M_device = &this->_mutex;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  ppFVar2 = (this->_queue).c.super__Deque_base<FuncCallInfo_*,_std::allocator<FuncCallInfo_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->_queue).c.super__Deque_base<FuncCallInfo_*,_std::allocator<FuncCallInfo_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur == ppFVar2) {
    do {
      std::_V2::condition_variable_any::wait<std::mutex>(&this->_empty_notify,&this->_mutex);
      ppFVar2 = (this->_queue).c.super__Deque_base<FuncCallInfo_*,_std::allocator<FuncCallInfo_*>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur;
    } while ((this->_queue).c.super__Deque_base<FuncCallInfo_*,_std::allocator<FuncCallInfo_*>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur == ppFVar2);
  }
  pFVar1 = *ppFVar2;
  std::deque<FuncCallInfo_*,_std::allocator<FuncCallInfo_*>_>::pop_front(&(this->_queue).c);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return pFVar1;
}

Assistant:

T Pop() {
        std::unique_lock<std::mutex> lock(_mutex);
        _empty_notify.wait(_mutex, [this]() {return !this->_queue.empty(); });

        auto ret = std::move(_queue.front());
        _queue.pop();
 
        return ret;
    }